

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

UInt32 LitEnc_GetPriceMatched(UInt16 *probs,UInt32 symbol,UInt32 matchByte,UInt32 *ProbPrices)

{
  uint uVar1;
  UInt32 offs;
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 matchByte_local;
  UInt32 symbol_local;
  UInt16 *probs_local;
  
  price = 0;
  offs = 0x100;
  matchByte_local = matchByte;
  symbol_local = symbol | 0x100;
  do {
    price = ProbPrices
            [(int)((uint)probs[offs + (matchByte_local << 1 & offs) + (symbol_local >> 8)] ^
                  -(symbol_local >> 7 & 1) & 0x7ff) >> 4] + price;
    uVar1 = symbol_local << 1;
    offs = ((matchByte_local ^ symbol_local) << 1 ^ 0xffffffff) & offs;
    matchByte_local = matchByte_local << 1;
    symbol_local = uVar1;
  } while (uVar1 < 0x10000);
  return price;
}

Assistant:

static UInt32 LitEnc_GetPriceMatched(const CLzmaProb *probs, UInt32 symbol, UInt32 matchByte, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  UInt32 offs = 0x100;
  symbol |= 0x100;
  do
  {
    matchByte <<= 1;
    price += GET_PRICEa(probs[offs + (matchByte & offs) + (symbol >> 8)], (symbol >> 7) & 1);
    symbol <<= 1;
    offs &= ~(matchByte ^ symbol);
  }
  while (symbol < 0x10000);
  return price;
}